

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O0

void __thiscall
stored_flag_reader<setup::registry_entry::flags_Enum_>::add
          (stored_flag_reader<setup::registry_entry::flags_Enum_> *this,enum_type flag)

{
  uchar uVar1;
  long in_RDI;
  flags<setup::data_entry::flags_Enum_,_12UL> *unaff_retaddr;
  long lVar2;
  
  lVar2 = in_RDI;
  if (*(long *)(in_RDI + 0x10) == 0) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    uVar1 = util::load<unsigned_char>((istream *)0x189476);
    *(uchar *)(in_RDI + 0x18) = uVar1;
  }
  if (((uint)*(byte *)(in_RDI + 0x18) & 1 << ((byte)*(undefined8 *)(in_RDI + 0x10) & 0x1f)) != 0) {
    flags<setup::data_entry::flags_Enum_,_12UL>::operator|=
              (unaff_retaddr,(enum_type)((ulong)lVar2 >> 0x20));
  }
  *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1U & 7;
  return;
}

Assistant:

void add(enum_type flag) {
		
		if(pos == 0) {
			bytes++;
			buffer = util::load<stored_type>(stream);
		}
		
		if(buffer & (stored_type(1) << pos)) {
			result |= flag;
		}
		
		pos = (pos + 1) % stored_bits;
	}